

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cpp
# Opt level: O1

void * IsoSpec::quickselect(void **array,int n,int start,int end)

{
  long lVar1;
  double dVar2;
  double *pdVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  result_type_conflict rVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  void *unaff_R13;
  
  if (start == end) {
    unaff_R13 = array[start];
  }
  else {
    do {
      rVar7 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                            *)&random_gen);
      uVar9 = rVar7 % (ulong)(long)(end - start);
      lVar8 = (long)start;
      pdVar3 = (double *)array[uVar9 + lVar8];
      dVar2 = *pdVar3;
      lVar10 = (long)end;
      lVar1 = lVar10 + -1;
      array[uVar9 + lVar8] = array[lVar10 + -1];
      array[lVar10 + -1] = pdVar3;
      iVar6 = start;
      if (start < end + -1) {
        do {
          pdVar3 = (double *)array[lVar8];
          if (*pdVar3 <= dVar2 && dVar2 != *pdVar3) {
            array[lVar8] = array[iVar6];
            array[iVar6] = pdVar3;
            iVar6 = iVar6 + 1;
          }
          lVar8 = lVar8 + 1;
        } while ((int)lVar1 != lVar8);
      }
      pvVar4 = array[lVar1];
      array[lVar1] = array[iVar6];
      array[iVar6] = pvVar4;
      if (iVar6 == n) {
        unaff_R13 = array[n];
        iVar5 = end;
      }
      else {
        iVar5 = iVar6;
        if (iVar6 <= n) {
          start = iVar6 + 1;
          iVar5 = end;
        }
      }
      end = iVar5;
    } while (iVar6 != n);
  }
  return unaff_R13;
}

Assistant:

void* quickselect(void ** array, int n, int start, int end)
{
    if(start == end)
        return array[start];

    while(true)
    {
        // Partition part
        int len = end - start;
#if ISOSPEC_BUILDING_R
        int pivot = len/2 + start;
#else
        size_t pivot = random_gen() % len + start;  // Using Mersenne twister directly - we don't
                                                    // need a very uniform distribution just for pivot
                                                    // selection
#endif
        void* pval = array[pivot];
        double pprob = getLProb(pval);
        std::swap(array[pivot], array[end-1]);
        int loweridx = start;
        for(int i = start; i < end-1; i++)
        {
            if(getLProb(array[i]) < pprob)
            {
                std::swap(array[i], array[loweridx]);
                loweridx++;
            }
        }
        std::swap(array[end-1], array[loweridx]);

        // Selection part
        if(n == loweridx)
            return array[n];
        if(n < loweridx)
            end = loweridx;
        else
            start = loweridx+1;
    };
}